

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriter.cpp
# Opt level: O2

void __thiscall
MILBlob::Blob::FileWriter::FileWriter(FileWriter *this,string *filePath,bool truncateFile)

{
  uint uVar1;
  runtime_error *this_00;
  _Ios_Openmode _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::fstream::fstream(this);
  _Var2 = (_Ios_Openmode)filePath;
  std::fstream::open((string *)this,_Var2);
  uVar1 = *(uint *)(&this->field_0x20 + *(long *)(*(long *)this + -0x18));
  if ((uVar1 & 5) != 0) {
    std::fstream::open((string *)this,_Var2);
    std::fstream::close();
    std::fstream::open((string *)this,_Var2);
    uVar1 = *(uint *)(&this->field_0x20 + *(long *)(*(long *)this + -0x18));
  }
  if ((uVar1 & 5) == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_60,"[MIL FileWriter]: Unable to open ",filePath);
  std::operator+(&local_40,&local_60," file stream for writing");
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FileWriter::FileWriter(const std::string& filePath, bool truncateFile)
{
    m_fileStream.open(filePath, GetWriterMode(truncateFile));
    if (!m_fileStream) {
        // If file does not exists, ios::in does not create one
        // Let's create a file and re-open with required flags
        m_fileStream.open(filePath, std::ofstream::binary | std::ios::out);
        m_fileStream.close();
        m_fileStream.open(filePath, GetWriterMode(truncateFile));
    }
    MILVerifyIsTrue(m_fileStream,
                    std::runtime_error,
                    "[MIL FileWriter]: Unable to open " + filePath + " file stream for writing");
}